

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall ktx::ValidationContext::validateDFD(ValidationContext *this)

{
  bool bVar1;
  uint *__s;
  char *pcVar2;
  size_t sVar3;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *args_3;
  ulong *puVar11;
  ulong uVar12;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  uint32_t numBlocks;
  vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> samples;
  ktx_uint32_t dfdByteLength;
  BDFD block;
  size_t remainingDFDBytes;
  uint32_t dfdTotalSize;
  uint numSamplesStored;
  uint local_c0;
  uint local_bc;
  string local_b8;
  int local_90;
  uint local_8c;
  string local_88;
  uint *local_60;
  ulong local_58;
  uint local_4c;
  ulong local_48 [2];
  char *local_38;
  
  uVar12 = (ulong)(this->header).dataFormatDescriptor.byteOffset;
  local_8c = (this->header).dataFormatDescriptor.byteLength;
  if (local_8c != 0 && uVar12 != 0) {
    uVar5 = (ulong)local_8c;
    __s = (uint *)operator_new__(uVar5);
    memset(__s,0,uVar5);
    args_3 = "the DFD";
    local_60 = __s;
    (*this->_vptr_ValidationContext[2])(this,uVar12,__s,uVar5,7);
    uVar12 = (ulong)local_8c;
    local_4c = *__s;
    if (local_8c != local_4c) {
      error<unsigned_int_const&,unsigned_int&>(this,&DFD::SizeMismatch,&local_8c,&local_4c);
    }
    puVar11 = (ulong *)(__s + 1);
    local_c0 = 0;
    local_bc = 0;
    do {
      if ((ulong *)(uVar12 + (long)__s) <= puVar11) break;
      local_58 = (long)(uVar12 + (long)__s) - (long)puVar11;
      uVar8 = local_c0 + 1;
      if (uVar8 < 0xb) {
        if (local_58 < 8) {
          local_c0 = uVar8;
          error<unsigned_long_const&>(this,&DFD::NotEnoughDataForBlockHeader,&local_58);
          goto LAB_001aa67a;
        }
        uVar5 = *puVar11;
        uVar10 = (uint)(ushort)(uVar5 >> 0x30);
        if (uVar5 < 0x8000000000000) {
          local_88._M_dataplus._M_p._0_4_ = uVar10;
          local_c0 = uVar8;
          error<unsigned_int&,int>
                    (this,&DFD::DescriptorBlockSizeTooSmall,&local_c0,(int *)&local_88);
        }
        else if (local_58 < uVar5 >> 0x30) {
          local_88._M_dataplus._M_p._0_4_ = uVar10;
          local_c0 = uVar8;
          error<unsigned_int&,int,unsigned_long_const&>
                    (this,&DFD::DescriptorBlockSizeTooBig,&local_c0,(int *)&local_88,&local_58);
        }
        else {
          uVar7 = uVar5 & 0xfffe0000;
          if (uVar7 == 0 && (uVar5 & 0x1ffff) == 0) {
            if ((local_bc & 1) == 0) {
              if ((uint)(uVar5 >> 0x33) < 3) {
                local_88._M_dataplus._M_p._0_4_ = uVar10;
                local_c0 = uVar8;
                error<unsigned_int&,int>
                          (this,&DFD::BasicDescriptorBlockSizeTooSmall,&local_c0,(int *)&local_88);
                uVar4 = extraout_RAX;
              }
              else {
                if (local_c0 != 0) {
                  local_bc = 0;
                  local_c0 = uVar8;
                  goto LAB_001aaa4e;
                }
                local_88._M_dataplus._M_p = (pointer)*puVar11;
                local_88._M_string_length = puVar11[1];
                local_88.field_2._M_allocated_capacity = puVar11[2];
                local_c0 = uVar8;
                if (((ulong)local_88._M_dataplus._M_p & 0xf000000000000) != 0x8000000000000) {
                  local_b8._M_dataplus._M_p._0_4_ =
                       (uint)(ushort)((ulong)local_88._M_dataplus._M_p >> 0x30);
                  error<unsigned_int&,int>
                            (this,&DFD::BasicDescriptorBlockSizeInvalid,&local_c0,(int *)&local_b8);
                }
                uVar9 = (ushort)((ulong)local_88._M_dataplus._M_p >> 0x30) - 0x18;
                uVar6 = uVar9 >> 4;
                local_48[0] = CONCAT44(local_48[0]._4_4_,uVar6);
                uVar8 = 0x10;
                if (uVar9 < 0x100) {
                  uVar8 = uVar6;
                }
                if (0x10f < uVar9) {
                  local_90 = uVar6 - uVar8;
                  local_b8._M_dataplus._M_p =
                       (pointer)((((ulong)local_88._M_dataplus._M_p >> 0x30) - (ulong)(uVar8 << 4))
                                - 0x18);
                  args_3 = (char *)&local_90;
                  warning<unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_int,unsigned_long>
                            (this,&DFD::TooManySamples,&local_c0,(uint *)local_48,
                             &MAX_NUM_BDFD_SAMPLES,(uint *)args_3,(unsigned_long *)&local_b8);
                }
                std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::vector
                          ((vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)&local_b8,
                           (ulong)uVar8,(allocator_type *)&local_90);
                memcpy(local_b8._M_dataplus._M_p,puVar11 + 3,(ulong)(uVar8 << 4));
                validateDFDBasic(this,local_c0,local_60,(BDFD *)&local_88,
                                 (vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)
                                 &local_b8);
                uVar4 = extraout_RAX_00;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                  uVar4 = extraout_RAX_01;
                }
              }
              local_bc = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
            }
            else {
              local_bc = (uint)CONCAT71((uint7)(uint3)(local_c0 >> 8),1);
              local_c0 = uVar8;
              warning<unsigned_int&>(this,&DFD::MultipleBDFD,&local_c0);
            }
          }
          else if (((uVar5 & 0x1ffff) != 0) ||
                  (local_c0 = uVar8, uVar7 != 0xc0040000 && uVar7 != 0xc0020000)) {
            local_c0 = uVar8;
            pcVar2 = (char *)dfdToStringVendorID((uint)uVar5 & 0x1ffff);
            if (pcVar2 == (char *)0x0) {
              local_b8._M_dataplus._M_p = (pointer)(ulong)((uint)uVar5 & 0x1ffff);
              fmt.size_ = 2;
              fmt.data_ = (char *)0xa;
              args.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_3;
              args.desc_ = (unsigned_long_long)&local_b8;
              ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"(0x{:05X})",fmt,args);
            }
            else {
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              local_38 = pcVar2;
              sVar3 = strlen(pcVar2);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_88,local_38,local_38 + sVar3);
            }
            uVar7 = uVar5 >> 0x11 & 0x7fff;
            if ((uVar5 & 0x1ffff) == 0) {
              pcVar2 = (char *)dfdToStringDescriptorType(uVar7);
              if (pcVar2 == (char *)0x0) {
                fmt_01.size_ = 2;
                fmt_01.data_ = (char *)0xa;
                args_01.field_1.values_ =
                     (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_3;
                args_01.desc_ = (unsigned_long_long)local_48;
                local_48[0] = uVar7;
                ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)"(0x{:04X})",fmt_01,args_01);
              }
              else {
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                sVar3 = strlen(pcVar2);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_b8,pcVar2,pcVar2 + sVar3);
              }
            }
            else {
              fmt_00.size_ = 2;
              fmt_00.data_ = (char *)0xa;
              args_00.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_3;
              args_00.desc_ = (unsigned_long_long)local_48;
              local_48[0] = uVar7;
              ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)"(0x{:04X})",fmt_00,args_00);
            }
            warning<unsigned_int&,std::__cxx11::string,std::__cxx11::string>
                      (this,&DFD::UnknownDFDBlock,&local_c0,&local_88,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
        }
LAB_001aaa4e:
        uVar5 = 8;
        if (8 < uVar10) {
          uVar5 = (ulong)uVar10;
        }
        puVar11 = (ulong *)((long)puVar11 + uVar5);
        bVar1 = true;
      }
      else {
        local_c0 = uVar8;
        warning<unsigned_int&,unsigned_long_const&>(this,&DFD::TooManyDFDBlocks,&local_c0,&local_58)
        ;
LAB_001aa67a:
        bVar1 = false;
      }
    } while (bVar1);
    if ((local_bc & 1) == 0) {
      error<>(this,&DFD::MissingBDFD);
    }
    operator_delete__(local_60);
  }
  return;
}

Assistant:

void ValidationContext::validateDFD() {
    const auto dfdByteOffset = header.dataFormatDescriptor.byteOffset;
    const auto dfdByteLength = header.dataFormatDescriptor.byteLength;

    if (dfdByteOffset == 0 || dfdByteLength == 0)
        return; // There is no DFD block

    const auto buffer = std::make_unique<uint8_t[]>(dfdByteLength);
    read(dfdByteOffset, buffer.get(), dfdByteLength, "the DFD");
    const auto* ptrDFD = buffer.get();
    const auto* ptrDFDEnd = ptrDFD + dfdByteLength;
    const auto* ptrDFDIt = ptrDFD;

    uint32_t dfdTotalSize;
    std::memcpy(&dfdTotalSize, ptrDFDIt, sizeof(uint32_t));
    ptrDFDIt += sizeof(uint32_t);

    if (dfdByteLength != dfdTotalSize)
        error(DFD::SizeMismatch, dfdByteLength, dfdTotalSize);

    uint32_t numBlocks = 0;
    bool foundBDFD = false;

    while (ptrDFDIt < ptrDFDEnd) {
        const auto remainingDFDBytes = static_cast<std::size_t>(ptrDFDEnd - ptrDFDIt);

        if (++numBlocks > MAX_NUM_DFD_BLOCKS) {
            warning(DFD::TooManyDFDBlocks, numBlocks, remainingDFDBytes);
            break;
        }

        DFDHeader blockHeader{};
        if (remainingDFDBytes < sizeof(DFDHeader)) {
            error(DFD::NotEnoughDataForBlockHeader, remainingDFDBytes);
            break;
        }

        std::memcpy(&blockHeader, ptrDFDIt, sizeof(DFDHeader));

        if (blockHeader.descriptorBlockSize < sizeof(DFDHeader)) {
            error(DFD::DescriptorBlockSizeTooSmall, numBlocks, +blockHeader.descriptorBlockSize);

        } else if (blockHeader.descriptorBlockSize > remainingDFDBytes) {
            error(DFD::DescriptorBlockSizeTooBig, numBlocks, +blockHeader.descriptorBlockSize, remainingDFDBytes);

        } else {
            if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT) {
                if (std::exchange(foundBDFD, true)) {
                    warning(DFD::MultipleBDFD, numBlocks);

                } else if (blockHeader.descriptorBlockSize < sizeof(BDFD)) {
                    error(DFD::BasicDescriptorBlockSizeTooSmall, numBlocks, +blockHeader.descriptorBlockSize);

                } else if (numBlocks != 1) {
                    // The Basic DFD block has to be the first block.
                    foundBDFD = false;

                } else {
                    BDFD block{};
                    std::memcpy(&block, ptrDFDIt, sizeof(BDFD));

                    if ((block.descriptorBlockSize - 24) % 16 != 0)
                         error(DFD::BasicDescriptorBlockSizeInvalid, numBlocks, +block.descriptorBlockSize);

                    const auto numSamplesStored = (block.descriptorBlockSize - 24u) / 16u;
                    const auto numSamplesValidating = std::min(MAX_NUM_BDFD_SAMPLES, numSamplesStored);

                    if (numSamplesStored > MAX_NUM_BDFD_SAMPLES)
                        warning(DFD::TooManySamples, numBlocks, numSamplesStored, MAX_NUM_BDFD_SAMPLES,
                                numSamplesStored - numSamplesValidating,
                                block.descriptorBlockSize - sizeof(BDFD) - numSamplesValidating * sizeof(SampleType));

                    // Samples are located at the end of the block
                    std::vector<SampleType> samples(numSamplesValidating);
                    std::memcpy(samples.data(), ptrDFDIt + sizeof(BDFD), numSamplesValidating * sizeof(SampleType));

                    validateDFDBasic(numBlocks, reinterpret_cast<uint32_t*>(buffer.get()), block, samples);
                }

            } else if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS) {
                // TODO: Implement DFD validation for ADDITIONAL_DIMENSIONS

            } else if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES) {
                // TODO: Implement DFD validation for ADDITIONAL_PLANES

            } else {
                warning(DFD::UnknownDFDBlock,
                        numBlocks,
                        toString(khr_df_vendorid_e(blockHeader.vendorId)),
                        toString(khr_df_vendorid_e(blockHeader.vendorId), khr_df_khr_descriptortype_e(blockHeader.descriptorType)));
            }
        }

        ptrDFDIt += std::max(blockHeader.descriptorBlockSize, 8u);
    }

    if (!foundBDFD)
        error(DFD::MissingBDFD);
}